

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::TaskSet::Task::Task(Task *this,TaskSet *taskSet,Own<kj::_::PromiseNode> *nodeParam)

{
  Own<kj::_::PromiseNode> *other;
  PromiseNode *pPVar1;
  Own<kj::_::PromiseNode> *nodeParam_local;
  TaskSet *taskSet_local;
  Task *this_local;
  
  kj::_::Event::Event(&this->super_Event);
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_00cdcf50;
  Maybe<kj::Own<kj::TaskSet::Task>_>::Maybe(&this->next);
  this->prev = (Maybe<kj::Own<kj::TaskSet::Task>_> *)0x0;
  this->taskSet = taskSet;
  other = mv<kj::Own<kj::_::PromiseNode>>(nodeParam);
  Own<kj::_::PromiseNode>::Own(&this->node,other);
  pPVar1 = Own<kj::_::PromiseNode>::operator->(&this->node);
  (*pPVar1->_vptr_PromiseNode[1])();
  pPVar1 = Own<kj::_::PromiseNode>::operator->(&this->node);
  (**pPVar1->_vptr_PromiseNode)(pPVar1,this);
  return;
}

Assistant:

Task(TaskSet& taskSet, Own<_::PromiseNode>&& nodeParam)
      : taskSet(taskSet), node(kj::mv(nodeParam)) {
    node->setSelfPointer(&node);
    node->onReady(this);
  }